

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int VSC_Generic(FORM *form,int lines)

{
  FIELD *pFVar1;
  int local_2c;
  int local_28;
  int local_24;
  int rows_to_go;
  int res;
  FIELD *field;
  int lines_local;
  FORM *form_local;
  
  pFVar1 = form->current;
  local_24 = -0xc;
  local_2c = lines;
  if (lines < 1) {
    local_2c = -lines;
  }
  local_28 = local_2c;
  if (lines < 1) {
    if (form->toprow < local_2c) {
      local_28 = form->toprow;
    }
    if (0 < local_28) {
      form->currow = form->currow - local_28;
      form->toprow = form->toprow - local_28;
      local_24 = 0;
    }
  }
  else {
    if (pFVar1->drows - (int)pFVar1->rows < local_2c + form->toprow) {
      local_28 = (pFVar1->drows - (int)pFVar1->rows) - form->toprow;
    }
    if (0 < local_28) {
      form->currow = local_28 + form->currow;
      form->toprow = local_28 + form->toprow;
      local_24 = 0;
    }
  }
  return local_24;
}

Assistant:

static int VSC_Generic(FORM *form, int lines)
{
  FIELD *field = form->current;
  int res = E_REQUEST_DENIED;
  int rows_to_go = (lines > 0 ? lines : -lines);

  if (lines > 0)
    {
      if ( (rows_to_go + form->toprow) > (field->drows - field->rows) )
        rows_to_go = (field->drows - field->rows - form->toprow);

      if (rows_to_go > 0)
        {
          form->currow += rows_to_go;
          form->toprow += rows_to_go;
          res = E_OK;
        }
    }
  else
    {
      if (rows_to_go > form->toprow)
        rows_to_go = form->toprow;
      
      if (rows_to_go > 0)
        {
          form->currow -= rows_to_go;
          form->toprow -= rows_to_go;
          res = E_OK;
        }
    }
  return(res);
}